

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O2

void zlib_file(char *name,zlib_wrapper type,int width,int check,bool output_csv_format)

{
  string *this;
  pointer pbVar1;
  double dVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  size_type *psVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  undefined7 in_register_00000081;
  int b_1;
  long lVar10;
  ulong uVar11;
  int b;
  int iVar12;
  size_type __n;
  int b_2;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compressed;
  vector<unsigned_long,_std::allocator<unsigned_long>_> input_length;
  vector<const_char_*,_std::allocator<const_char_*>_> input;
  double ctime [5];
  undefined1 local_c0 [8];
  double local_b8;
  double dStack_b0;
  ulong local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  Data file;
  double utime [5];
  
  read_file_data_or_exit(&file,name);
  if (check == 0) {
    pcVar3 = zlib_level_strategy_name(zlib_compression_level);
    local_b8 = (double)CONCAT44(local_b8._4_4_,(int)CONCAT71(in_register_00000081,output_csv_format)
                               );
    if (!output_csv_format) {
      printf("%s%-40s :\n",pcVar3,name);
    }
    uVar11 = (long)(int)((uint)file.size + 0xfffff) / 0x100000;
    iVar8 = (int)uVar11;
    __n = (size_type)iVar8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (&input,__n,(allocator_type *)ctime);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&input_length,__n,(allocator_type *)ctime);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&compressed,__n,(allocator_type *)ctime);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&output,__n,(allocator_type *)ctime);
    uVar4 = 0;
    uVar11 = uVar11 & 0xffffffff;
    if (iVar8 < 1) {
      uVar11 = uVar4;
    }
    iVar8 = 0x100000;
    uVar9 = 0;
    while( true ) {
      lVar7 = (long)iVar8;
      if ((long)(int)(uint)file.size <= (long)iVar8) {
        lVar7 = (long)(int)(uint)file.size;
      }
      if (uVar11 == uVar9) break;
      ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)
      (input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start + uVar9))->_M_t =
           (tuple<char_*,_std::default_delete<char[]>_>)
           file.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      input_length.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] = lVar7 + uVar4;
      uVar9 = uVar9 + 1;
      file.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
           ((long)file.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x100000);
      iVar8 = iVar8 + 0x100000;
      uVar4 = uVar4 - 0x100000;
    }
    uVar4 = (long)(int)((uint)file.size + 0xa00000) / (long)(int)((uint)file.size + 1);
    lVar7 = 0;
    iVar8 = (int)uVar4;
    uVar9 = 0;
    if (0 < iVar8) {
      uVar9 = uVar4 & 0xffffffff;
    }
    local_a8 = (ulong)(uint)file.size;
    for (; uVar4 = local_a8, dVar2 = local_b8, lVar7 != 5; lVar7 = lVar7 + 1) {
      for (lVar10 = 0;
          pbVar1 = compressed.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, uVar11 << 5 != lVar10;
          lVar10 = lVar10 + 0x20) {
        compressBound(0x100000);
        std::__cxx11::string::resize((long)&(pbVar1->_M_dataplus)._M_p + lVar10);
      }
      lVar10 = std::chrono::_V2::steady_clock::now();
      for (uVar4 = 0; uVar13 = uVar9, uVar4 != uVar11; uVar4 = uVar4 + 1) {
        while ((int)uVar13 != 0) {
          zlib_compress(type,input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar4],
                        input_length.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar4],
                        compressed.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar4,false);
          uVar13 = (ulong)((int)uVar13 - 1);
        }
      }
      lVar5 = std::chrono::_V2::steady_clock::now();
      ctime[lVar7] = (double)(lVar5 - lVar10) / 1000000000.0;
      lVar10 = 0;
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        zlib_compress(type,input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar4],
                      input_length.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar4],
                      (string *)
                      ((long)&((compressed.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar10),true);
        lVar10 = lVar10 + 0x20;
      }
      lVar10 = 0;
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        std::__cxx11::string::resize
                  ((long)&((output.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10);
        lVar10 = lVar10 + 0x20;
      }
      lVar10 = std::chrono::_V2::steady_clock::now();
      for (iVar12 = 0; iVar12 != (int)uVar9; iVar12 = iVar12 + 1) {
        lVar5 = 0;
        for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
          zlib_uncompress(type,(string *)
                               ((long)&((compressed.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar5),
                          input_length.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4],
                          (string *)
                          ((long)&((output.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar5));
          lVar5 = lVar5 + 0x20;
        }
      }
      lVar5 = std::chrono::_V2::steady_clock::now();
      utime[lVar7] = (double)(lVar5 - lVar10) / 1000000000.0;
      lVar10 = 0;
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        verify_equal(input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4],
                     input_length.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar4],
                     (string *)
                     ((long)&((output.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar10));
        lVar10 = lVar10 + 0x20;
      }
    }
    lVar7 = (long)compressed.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)compressed.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    psVar6 = &(compressed.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    lVar10 = 0;
    while (bVar14 = lVar7 != 0, lVar7 = lVar7 + -1, bVar14) {
      lVar10 = lVar10 + *psVar6;
      psVar6 = psVar6 + 4;
    }
    std::__sort<double*,__gnu_cxx::__ops::_Iter_less_iter>(ctime,local_c0);
    std::__sort<double*,__gnu_cxx::__ops::_Iter_less_iter>(utime,&stack0xffffffffffffffd0);
    iVar12 = (int)uVar4;
    iVar8 = iVar8 * iVar12;
    dVar15 = (double)(iVar8 / 0x100000);
    auVar16._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar16._0_8_ = lVar10;
    auVar16._12_4_ = 0x45300000;
    dVar17 = auVar16._8_8_ - 1.9342813113834067e+25;
    if (SUB81(dVar2,0) == '\0') {
      local_b8 = ((dVar17 + ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) * 100.0
                 ) / (double)iVar12;
      dStack_b0 = dVar17;
      pcVar3 = zlib_wrapper_name(type);
      printf("%s: [b %dM] bytes %*d -> %*u %4.2f%%",local_b8,pcVar3,1,(ulong)(uint)width,
             uVar4 & 0xffffffff,(ulong)(uint)width,(int)lVar10);
      printf(" comp %5.1f (%5.1f) MB/s uncomp %5.1f (%5.1f) MB/s\n",dVar15 / ctime[2],
             dVar15 / ctime[0],dVar15 / utime[2],dVar15 / utime[0]);
    }
    else {
      printf("%s\t%.5lf\t%.5lf\t%.5lf\t%.5lf\t%.5lf\n",name,(long)iVar8 % 0x100000 & 0xffffffff);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&compressed);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&input_length.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&input.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  }
  else {
    this = &file.name;
    std::__cxx11::string::find_last_of((char *)this,0x1041b7);
    std::__cxx11::string::substr((ulong)ctime,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)ctime);
    std::__cxx11::string::~string((string *)ctime);
    check_file(&file,type,check);
  }
  Data::~Data(&file);
  return;
}

Assistant:

void zlib_file(const char* name,
               zlib_wrapper type,
               int width,
               int check,
               bool output_csv_format) {
  /*
   * Read the file data.
   */
  struct Data file = read_file_data_or_exit(name);
  const int length = static_cast<int>(file.size);
  const char* data = file.data.get();

  /*
   * Compress file: report output data checks and return.
   */
  if (check) {
    file.name = file.name.substr(file.name.find_last_of("/\\") + 1);
    check_file(file, type, check);
    return;
  }

  /*
   * Report compression strategy and file name.
   */
  const char* strategy = zlib_level_strategy_name(zlib_compression_level);
  if (!output_csv_format) {
    printf("%s%-40s :\n", strategy, name);
  }

  /*
   * Chop the data into blocks.
   */
  const int block_size = 1 << 20;
  const int blocks = (length + block_size - 1) / block_size;

  std::vector<const char*> input(blocks);
  std::vector<size_t> input_length(blocks);
  std::vector<std::string> compressed(blocks);
  std::vector<std::string> output(blocks);

  for (int b = 0; b < blocks; ++b) {
    int input_start = b * block_size;
    int input_limit = std::min<int>((b + 1) * block_size, length);
    input[b] = data + input_start;
    input_length[b] = input_limit - input_start;
  }

  /*
   * Run the zlib compress/uncompress loop a few times with |repeats| to
   * process about 10MB of data if the length is small relative to 10MB.
   * If length is large relative to 10MB, process the data once.
   */
  const int mega_byte = 1024 * 1024;
  const int repeats = (10 * mega_byte + length) / (length + 1);
  const int runs = 5;
  double ctime[runs];
  double utime[runs];

  for (int run = 0; run < runs; ++run) {
    const auto now = [] { return std::chrono::steady_clock::now(); };

    // Pre-grow the output buffer so we don't measure string resize time.
    for (int b = 0; b < blocks; ++b)
      compressed[b].resize(zlib_estimate_compressed_size(block_size));

    auto start = now();
    for (int b = 0; b < blocks; ++b)
      for (int r = 0; r < repeats; ++r)
        zlib_compress(type, input[b], input_length[b], &compressed[b]);
    ctime[run] = std::chrono::duration<double>(now() - start).count();

    // Compress again, resizing compressed, so we don't leave junk at the
    // end of the compressed string that could confuse zlib_uncompress().
    for (int b = 0; b < blocks; ++b)
      zlib_compress(type, input[b], input_length[b], &compressed[b], true);

    for (int b = 0; b < blocks; ++b)
      output[b].resize(input_length[b]);

    start = now();
    for (int r = 0; r < repeats; ++r)
      for (int b = 0; b < blocks; ++b)
        zlib_uncompress(type, compressed[b], input_length[b], &output[b]);
    utime[run] = std::chrono::duration<double>(now() - start).count();

    for (int b = 0; b < blocks; ++b)
      verify_equal(input[b], input_length[b], &output[b]);
  }

  /*
   * Output the median/maximum compress/uncompress rates in MB/s.
   */
  size_t output_length = 0;
  for (size_t i = 0; i < compressed.size(); ++i)
    output_length += compressed[i].size();

  std::sort(ctime, ctime + runs);
  std::sort(utime, utime + runs);

  double deflate_rate_med, inflate_rate_med, deflate_rate_max, inflate_rate_max;
  deflate_rate_med = length * repeats / mega_byte / ctime[runs / 2];
  inflate_rate_med = length * repeats / mega_byte / utime[runs / 2];
  deflate_rate_max = length * repeats / mega_byte / ctime[0];
  inflate_rate_max = length * repeats / mega_byte / utime[0];
  double compress_ratio = output_length * 100.0 / length;

  if (!output_csv_format) {
    // type, block size, compression ratio, etc
    printf("%s: [b %dM] bytes %*d -> %*u %4.2f%%", zlib_wrapper_name(type),
           block_size / (1 << 20), width, length, width,
           unsigned(output_length), compress_ratio);

    // compress / uncompress median (max) rates
    printf(" comp %5.1f (%5.1f) MB/s uncomp %5.1f (%5.1f) MB/s\n",
           deflate_rate_med, deflate_rate_max, inflate_rate_med,
           inflate_rate_max);
  } else {
    printf("%s\t%.5lf\t%.5lf\t%.5lf\t%.5lf\t%.5lf\n", name, deflate_rate_med,
           inflate_rate_med, deflate_rate_max, inflate_rate_max,
           compress_ratio);
  }
}